

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintAsCharLiteralTo<unsigned_char,signed_char>(char c,ostream *os)

{
  ostream *os_00;
  bool bVar1;
  String local_28;
  ostream *local_18;
  ostream *os_local;
  char c_local;
  
  local_18 = os;
  os_local._3_1_ = c;
  switch(c) {
  case '\0':
    std::operator<<(os,"\\0");
    break;
  default:
    bVar1 = IsPrintableAscii((int)c);
    os_00 = local_18;
    if (!bVar1) {
      String::Format(&local_28,"\\x%X",(ulong)os_local._3_1_);
      operator<<(os_00,&local_28);
      String::~String(&local_28);
      return kHexEscape;
    }
    std::operator<<(local_18,os_local._3_1_);
    return kAsIs;
  case '\a':
    std::operator<<(os,"\\a");
    break;
  case '\b':
    std::operator<<(os,"\\b");
    break;
  case '\t':
    std::operator<<(os,"\\t");
    break;
  case '\n':
    std::operator<<(os,"\\n");
    break;
  case '\v':
    std::operator<<(os,"\\v");
    break;
  case '\f':
    std::operator<<(os,"\\f");
    break;
  case '\r':
    std::operator<<(os,"\\r");
    break;
  case '\'':
    std::operator<<(os,"\\\'");
    break;
  case '\\':
    std::operator<<(os,"\\\\");
  }
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  switch (static_cast<wchar_t>(c)) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        *os << String::Format("\\x%X", static_cast<UnsignedChar>(c));
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}